

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lodtalk.cpp
# Opt level: O0

void loadKernel(void)

{
  VMContext *pVVar1;
  allocator local_29;
  string local_28 [32];
  
  pVVar1 = context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"runtime/runtime.lodtalk",&local_29);
  Lodtalk::VMContext::executeScriptFromFileNamed((string *)pVVar1);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

void loadKernel()
{
    context->executeScriptFromFileNamed("runtime/runtime.lodtalk");
}